

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O3

vx_mesh_t *
vx_voxelize(vx_mesh_t *m,float voxelsizex,float voxelsizey,float voxelsizez,float precision)

{
  vx_hash_table_node_t **ppvVar1;
  size_t sVar2;
  vx_triangle_t triangle_00;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  vx_hash_table_t *table;
  long lVar6;
  vx_vertex_t *pvVar7;
  vx_hash_table_node_t *pvVar8;
  vx_hash_table_node *pvVar9;
  ulong uVar10;
  vx_mesh_t *mesh;
  uint *puVar11;
  long lVar12;
  size_t sVar13;
  float *pfVar14;
  vx_vertex_t *v1;
  long lVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float in_XMM1_Db;
  float fVar29;
  float in_XMM2_Db;
  vx_vertex_t boxcenter;
  vx_vertex_t halfboxsize;
  size_t a;
  vx_triangle_t triangle;
  float local_210;
  undefined8 local_208;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float fStack_16c;
  ulong local_168;
  ulong uStack_160;
  float local_158;
  float fStack_154;
  float local_150;
  float local_14c;
  float fStack_148;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  size_t local_108;
  vx_mesh_t *local_100;
  ulong local_f8;
  anon_union_12_2_12391dad_for_vx_vertex_0 local_f0;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  float fStack_dc;
  undefined8 uStack_d8;
  float local_d0;
  float local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float local_58;
  float fStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined1 local_48 [16];
  
  bVar16 = 0;
  local_a8 = ZEXT416((uint)(voxelsizex * 0.5));
  local_138 = voxelsizey * 0.5;
  fStack_134 = voxelsizez * 0.5;
  fStack_130 = in_XMM1_Db * 0.0;
  fStack_12c = in_XMM2_Db * 0.0;
  local_128 = voxelsizey;
  table = vx__hash_table_alloc(0x1000);
  local_108 = m->nindices;
  local_98 = fStack_134;
  fStack_94 = fStack_134;
  fStack_90 = fStack_134;
  fStack_8c = fStack_134;
  local_100 = m;
  if (local_108 == 0) {
    lVar15 = 0;
  }
  else {
    local_c8 = -voxelsizex;
    uStack_c4 = in_XMM0_Db ^ 0x80000000;
    uStack_c0 = in_XMM0_Dc ^ 0x80000000;
    uStack_bc = in_XMM0_Dd ^ 0x80000000;
    local_b8 = -voxelsizey;
    fStack_b4 = -voxelsizez;
    fStack_b0 = -in_XMM1_Db;
    fStack_ac = -in_XMM2_Db;
    fStack_84 = local_128;
    uVar10 = 0;
    lVar15 = 0;
    local_88 = voxelsizex;
    fStack_80 = voxelsizez;
    fStack_7c = voxelsizex;
    do {
      pvVar7 = local_100->vertices;
      puVar11 = local_100->indices;
      local_f0.v[2] = pvVar7[puVar11[uVar10]].field_0.v[2];
      local_f0._0_8_ = *(undefined8 *)&pvVar7[puVar11[uVar10]].field_0;
      uStack_e4 = (undefined4)*(undefined8 *)&pvVar7[puVar11[uVar10 + 1]].field_0;
      uStack_e0 = (undefined4)((ulong)*(undefined8 *)&pvVar7[puVar11[uVar10 + 1]].field_0 >> 0x20);
      fStack_dc = pvVar7[puVar11[uVar10 + 1]].field_0.v[2];
      uStack_d8 = *(undefined8 *)&pvVar7[puVar11[uVar10 + 2]].field_0;
      local_d0 = pvVar7[puVar11[uVar10 + 2]].field_0.v[2];
      fVar19 = vx__triangle_area((vx_triangle_t *)&local_f0.field_1);
      if (1e-07 <= fVar19) {
        vx__triangle_aabb((vx_triangle_t *)&local_f0.field_1);
        fVar20 = floorf(((float)(~-(uint)(local_198 < 0.0) & (uint)voxelsizex |
                                -(uint)(local_198 < 0.0) & (uint)local_c8) * 0.5 + local_198) /
                        voxelsizex);
        auVar27._4_4_ = voxelsizez;
        auVar27._0_4_ = voxelsizey;
        auVar27._8_4_ = in_XMM1_Db;
        auVar27._12_4_ = in_XMM2_Db;
        auVar26._0_4_ =
             (float)(~-(uint)(fStack_194 < 0.0) & (uint)voxelsizey |
                    (uint)local_b8 & -(uint)(fStack_194 < 0.0)) * 0.5 + fStack_194;
        auVar26._4_4_ =
             (float)(~-(uint)(fStack_190 < 0.0) & (uint)voxelsizez |
                    (uint)fStack_b4 & -(uint)(fStack_190 < 0.0)) * 0.5 + fStack_190;
        auVar26._8_4_ = in_XMM1_Db * 0.0 + 0.0;
        auVar26._12_4_ = in_XMM2_Db * 0.0 + 0.0;
        auVar27 = divps(auVar26,auVar27);
        fVar21 = floorf(auVar27._0_4_);
        local_208._4_4_ = auVar27._4_4_;
        fVar22 = floorf(local_208._4_4_);
        fVar23 = ceilf(((float)(~-(uint)(fStack_18c < 0.0) & (uint)voxelsizex |
                               -(uint)(fStack_18c < 0.0) & (uint)local_c8) * 0.5 + fStack_18c) /
                       voxelsizex);
        fVar20 = fVar20 * local_88;
        fVar21 = fVar21 * fStack_84;
        fVar22 = fVar22 * fStack_80;
        fVar23 = fVar23 * fStack_7c;
        fVar19 = (float)(local_188 >> 0x20);
        uVar17 = -(uint)((float)local_188 < 0.0);
        uVar18 = -(uint)(fVar19 < 0.0);
        auVar3._4_4_ = voxelsizez;
        auVar3._0_4_ = voxelsizey;
        auVar3._8_4_ = in_XMM1_Db;
        auVar3._12_4_ = in_XMM2_Db;
        auVar28._0_4_ =
             (float)(~uVar17 & (uint)voxelsizey | (uint)local_b8 & uVar17) * 0.5 + (float)local_188;
        auVar28._4_4_ =
             (float)(~uVar18 & (uint)voxelsizez | (uint)fStack_b4 & uVar18) * 0.5 + fVar19;
        auVar28._8_4_ = in_XMM1_Db * 0.0 + 0.0;
        auVar28._12_4_ = in_XMM2_Db * 0.0 + 0.0;
        auVar27 = divps(auVar28,auVar3);
        local_198 = fVar20;
        fStack_194 = fVar21;
        fStack_190 = fVar22;
        fStack_18c = fVar23;
        fVar19 = ceilf(auVar27._0_4_);
        local_208._4_4_ = auVar27._4_4_;
        fVar24 = ceilf(local_208._4_4_);
        fVar19 = fVar19 * voxelsizey;
        fVar24 = fVar24 * voxelsizez;
        local_188 = CONCAT44(fVar24,fVar19);
        if (fVar20 < fVar23) {
          local_118._4_4_ = fVar24;
          local_118._0_4_ = fVar24;
          fStack_110 = fVar24;
          fStack_10c = fVar24;
          fVar25 = fVar23;
          do {
            local_210 = fStack_194;
            if (fStack_194 < fVar19) {
              local_78 = ((fVar20 - (float)local_a8._0_4_) + (float)local_a8._0_4_ + fVar20) * 0.5;
              uStack_64 = local_a8._4_4_ & 0x7fffffff;
              uStack_60 = local_a8._8_4_ & 0x7fffffff;
              uStack_5c = local_a8._12_4_ & 0x7fffffff;
              local_68 = ABS(((float)local_a8._0_4_ + fVar20) - (fVar20 - (float)local_a8._0_4_)) *
                         0.5 + precision;
              local_f8 = (ulong)(local_78 * 7.38561e+07);
              local_f8 = (long)(local_78 * 7.38561e+07 - 9.223372e+18) & (long)local_f8 >> 0x3f |
                         local_f8;
              fVar29 = local_128;
              fStack_74 = fVar21;
              fStack_70 = fVar22;
              fStack_6c = fVar23;
              do {
                fVar25 = local_78;
                if (fStack_190 < fVar24) {
                  fVar24 = ((local_210 - local_138) + local_138 + local_210) * 0.5;
                  fStack_54 = ABS((local_138 + local_210) - (local_210 - local_138)) * 0.5 +
                              precision;
                  local_58 = local_68;
                  uStack_50 = uStack_60;
                  uStack_4c = uStack_5c;
                  lVar6 = (long)(fVar24 * 19349664.0);
                  uVar17 = (uint)local_f8;
                  local_208 = CONCAT44(fVar24,local_78);
                  fVar19 = fStack_190;
                  do {
                    fVar29 = ((fVar19 - local_98) + local_98 + fVar19) * 0.5;
                    halfboxsize.field_0._8_4_ =
                         ABS((local_98 + fVar19) - (fVar19 - local_98)) * 0.5 + precision;
                    triangle_00.p2.field_0.v[0] = (float)uStack_e4;
                    triangle_00.p1.field_0.v[2] = local_f0.v[2];
                    triangle_00.p2.field_0.v[2] = fStack_dc;
                    triangle_00.p2.field_0.v[1] = (float)uStack_e0;
                    boxcenter.field_0.v[1] = fVar24;
                    boxcenter.field_0.v[0] = fVar25;
                    local_48 = ZEXT416((uint)fVar29);
                    halfboxsize.field_0.v[1] = fStack_54;
                    halfboxsize.field_0.v[0] = local_58;
                    triangle_00.p1.field_0._0_8_ = local_f0._0_8_;
                    triangle_00.p3.field_0._0_8_ = uStack_d8;
                    triangle_00.p3.field_0.v[2] = local_d0;
                    boxcenter.field_0.v[2] = fVar29;
                    iVar5 = vx__triangle_box_overlap(boxcenter,halfboxsize,triangle_00);
                    if (iVar5 != 0) {
                      pvVar7 = (vx_vertex_t *)malloc(0xc);
                      *(undefined8 *)&pvVar7->field_0 = local_208;
                      (pvVar7->field_0).v[2] = (float)local_48._0_4_;
                      lVar12 = (long)((float)local_48._0_4_ * 8.349279e+07);
                      uVar18 = (((uint)lVar12 |
                                (uint)(long)((float)local_48._0_4_ * 8.349279e+07 - 9.223372e+18) &
                                (uint)(lVar12 >> 0x3f)) ^
                               ((uint)(long)(fVar24 * 19349664.0 - 9.223372e+18) &
                                (uint)(lVar6 >> 0x3f) | (uint)lVar6) ^ uVar17) & 0xfff;
                      ppvVar1 = table->elements;
                      pvVar8 = ppvVar1[uVar18];
                      if (pvVar8 == (vx_hash_table_node_t *)0x0) {
                        pvVar8 = (vx_hash_table_node_t *)malloc(0x18);
                        ppvVar1[uVar18] = pvVar8;
                        pvVar8->prev = (vx_hash_table_node *)0x0;
                        ppvVar1[uVar18]->next = (vx_hash_table_node *)0x0;
                        ppvVar1[uVar18]->data = pvVar7;
LAB_0010b0ab:
                        lVar15 = lVar15 + 1;
                      }
                      else {
                        v1 = (vx_vertex_t *)pvVar8->data;
                        while (bVar4 = vx__vertex_equals(v1,pvVar7), !bVar4) {
                          pvVar9 = pvVar8->next;
                          if (pvVar9 == (vx_hash_table_node *)0x0) {
                            pvVar9 = (vx_hash_table_node *)malloc(0x18);
                            pvVar9->prev = pvVar8;
                            pvVar9->next = (vx_hash_table_node *)0x0;
                            pvVar9->data = pvVar7;
                            pvVar8->next = pvVar9;
                            _local_118 = ZEXT416(local_188._4_4_);
                            goto LAB_0010b0ab;
                          }
                          v1 = (vx_vertex_t *)pvVar9->data;
                          pvVar8 = pvVar9;
                        }
                      }
                    }
                    fVar19 = fVar19 + voxelsizez;
                  } while (fVar19 < (float)local_118._0_4_);
                  fVar19 = (float)local_188;
                  fVar24 = (float)local_118._0_4_;
                  fVar29 = local_128;
                }
                local_210 = local_210 + fVar29;
                fVar25 = fStack_18c;
              } while (local_210 < fVar19);
            }
            fVar20 = fVar20 + voxelsizex;
          } while (fVar20 < fVar25);
        }
      }
      uVar10 = uVar10 + 3;
    } while (uVar10 < local_108);
  }
  mesh = (vx_mesh_t *)malloc(0x38);
  mesh->nnormals = 6;
  pvVar7 = (vx_vertex_t *)calloc(lVar15 * 0x60,1);
  mesh->vertices = pvVar7;
  pvVar7 = (vx_vertex_t *)calloc(0x48,1);
  mesh->normals = pvVar7;
  puVar11 = (uint *)calloc(lVar15 * 0x90,1);
  mesh->indices = puVar11;
  puVar11 = (uint *)calloc(lVar15 * 0x90,1);
  mesh->normalindices = puVar11;
  mesh->nindices = 0;
  mesh->nvertices = 0;
  pfVar14 = vx_normals;
  for (lVar15 = 0x12; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pvVar7->field_0).v[0] = *pfVar14;
    pfVar14 = pfVar14 + (ulong)bVar16 * -2 + 1;
    pvVar7 = (vx_vertex_t *)((long)pvVar7 + (ulong)bVar16 * -8 + 4);
  }
  local_198 = -(float)local_a8._0_4_;
  fStack_194 = local_138;
  fStack_190 = fStack_134;
  local_180 = (float)local_a8._0_4_;
  local_178 = local_98;
  local_174 = (float)local_a8._0_4_;
  local_170 = local_138;
  fStack_16c = fStack_134;
  local_17c = -local_138;
  fStack_154 = -fStack_134;
  uStack_160 = CONCAT44(local_a8._0_4_,fStack_134) ^ 0x8000000080000000;
  local_168 = CONCAT44(local_138,local_a8._0_4_) ^ 0x80000000;
  local_188 = CONCAT44(local_98,local_138) ^ 0x80000000;
  local_150 = (float)local_a8._0_4_;
  local_144 = (float)local_a8._0_4_;
  local_140 = local_138;
  sVar2 = table->size;
  fStack_18c = local_198;
  local_158 = local_17c;
  local_14c = local_17c;
  fStack_148 = fStack_154;
  local_13c = fStack_154;
  if (sVar2 != 0) {
    ppvVar1 = table->elements;
    sVar13 = 0;
    do {
      pvVar8 = ppvVar1[sVar13];
      if (pvVar8 != (vx_hash_table_node_t *)0x0) {
        vx__add_voxel(mesh,(vx_vertex_t *)pvVar8->data,&local_198);
        for (pvVar9 = pvVar8->next; pvVar9 != (vx_hash_table_node *)0x0; pvVar9 = pvVar9->next) {
          vx__add_voxel(mesh,(vx_vertex_t *)pvVar9->data,&local_198);
        }
      }
      sVar13 = sVar13 + 1;
    } while (sVar13 != sVar2);
  }
  vx__hash_table_free(table,true);
  return mesh;
}

Assistant:

vx_mesh_t* vx_voxelize(vx_mesh_t* m,
    float voxelsizex,
    float voxelsizey,
    float voxelsizez,
    float precision)
{
    vx_mesh_t* outmesh = NULL;
    vx_hash_table_t* table = NULL;
    size_t voxels = 0;

    float halfsizex = voxelsizex * 0.5f;
    float halfsizey = voxelsizey * 0.5f;
    float halfsizez = voxelsizez * 0.5f;

    table = vx__hash_table_alloc(VOXELIZER_HASH_TABLE_SIZE);

    for (int i = 0; i < m->nindices; i += 3) {
        vx_triangle_t triangle;

        VX_ASSERT(m->indices[i+0] < m->nvertices);
        VX_ASSERT(m->indices[i+1] < m->nvertices);
        VX_ASSERT(m->indices[i+2] < m->nvertices);

        triangle.p1 = m->vertices[m->indices[i+0]];
        triangle.p2 = m->vertices[m->indices[i+1]];
        triangle.p3 = m->vertices[m->indices[i+2]];

        if (vx__triangle_area(&triangle) < VOXELIZER_EPSILON) {
            // triangle with 0 area
            continue;
        }

        vx_aabb_t aabb = vx__triangle_aabb(&triangle);

        aabb.min.x = vx__map_to_voxel(aabb.min.x, voxelsizex, true);
        aabb.min.y = vx__map_to_voxel(aabb.min.y, voxelsizey, true);
        aabb.min.z = vx__map_to_voxel(aabb.min.z, voxelsizez, true);

        aabb.max.x = vx__map_to_voxel(aabb.max.x, voxelsizex, false);
        aabb.max.y = vx__map_to_voxel(aabb.max.y, voxelsizey, false);
        aabb.max.z = vx__map_to_voxel(aabb.max.z, voxelsizez, false);

        for (float x = aabb.min.x; x < aabb.max.x; x += voxelsizex) {
            for (float y = aabb.min.y; y < aabb.max.y; y += voxelsizey) {
                for (float z = aabb.min.z; z < aabb.max.z; z += voxelsizez) {
                    vx_aabb_t saabb;

                    saabb.min.x = x - halfsizex;
                    saabb.min.y = y - halfsizey;
                    saabb.min.z = z - halfsizez;
                    saabb.max.x = x + halfsizex;
                    saabb.max.y = y + halfsizey;
                    saabb.max.z = z + halfsizez;

                    vx_vertex_t boxcenter = vx__aabb_center(&saabb);
                    vx_vertex_t halfsize = vx__aabb_half_size(&saabb);

                    // HACK: some holes might appear, this
                    // precision factor reduces the artifact
                    halfsize.x += precision;
                    halfsize.y += precision;
                    halfsize.z += precision;

                    if (vx__triangle_box_overlap(boxcenter, halfsize, triangle)) {
                        vx_vertex_t* nodedata = VX_MALLOC(vx_vertex_t, 1);
                        *nodedata = boxcenter;

                        size_t hash = vx__vertex_hash(boxcenter, VOXELIZER_HASH_TABLE_SIZE);

                        bool insert = vx__hash_table_insert(table,
                                hash,
                                nodedata,
                                vx__vertex_comp_func);

                        if (insert) {
                            voxels++;
                        }
                   }
                }
            }
        }
    }

    outmesh = VX_MALLOC(vx_mesh_t, 1);
    size_t nvertices = voxels * 8;
    size_t nindices = voxels * VOXELIZER_INDICES_SIZE;
    outmesh->nnormals = VOXELIZER_NORMAL_INDICES_SIZE;
    outmesh->vertices = VX_CALLOC(vx_vertex_t, nvertices);
    outmesh->normals = VX_CALLOC(vx_vertex_t, 6);
    outmesh->indices = VX_CALLOC(unsigned int, nindices);
    outmesh->normalindices = VX_CALLOC(unsigned int, nindices);
    outmesh->nindices = 0;
    outmesh->nvertices = 0;

    memcpy(outmesh->normals, vx_normals, 18 * sizeof(float));

    float vertices[24] = {
        -halfsizex,  halfsizey,  halfsizez,
        -halfsizex, -halfsizey,  halfsizez,
         halfsizex, -halfsizey,  halfsizez,
         halfsizex,  halfsizey,  halfsizez,
        -halfsizex,  halfsizey, -halfsizez,
        -halfsizex, -halfsizey, -halfsizez,
         halfsizex, -halfsizey, -halfsizez,
         halfsizex,  halfsizey, -halfsizez,
    };

    for (size_t i = 0; i < table->size; ++i) {
        if (table->elements[i] != NULL) {
            vx_hash_table_node_t* node = table->elements[i];

            if (!node) {
                continue;
            }

            vx_vertex_t* p = (vx_vertex_t*) node->data;
            vx__add_voxel(outmesh, p, vertices);

            while (node->next) {
                node = node->next;
                p = (vx_vertex_t*) node->data;
                vx__add_voxel(outmesh, p, vertices);
            }
        }
    }

    vx__hash_table_free(table, true);

    return outmesh;
}